

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

SubControl __thiscall
QStyleSheetStyle::hitTestComplexControl
          (QStyleSheetStyle *this,ComplexControl cc,QStyleOptionComplex *opt,QPoint *pt,QWidget *w)

{
  long lVar1;
  QStyleSheetStyle *pQVar2;
  char cVar3;
  bool bVar4;
  SubControl SVar5;
  QStyle *pQVar6;
  QStyleOptionTitleBar *pQVar7;
  QRect *pQVar8;
  QPoint *pQVar9;
  QPoint *pQVar10;
  long in_FS_OFFSET;
  SubControl local_dc;
  QPoint local_d8;
  undefined8 uStack_d0;
  QHash<QStyle::SubControl,_QRect> layout;
  QRenderRule rule;
  
  pQVar2 = globalStyleSheetStyle;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar6 = baseStyle(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      SVar5 = (**(code **)(*(long *)pQVar6 + 0xd0))
                        (pQVar6,cc,opt,pt,w,*(code **)(*(long *)pQVar6 + 0xd0));
      return SVar5;
    }
    goto LAB_0034cfc0;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  switch(cc) {
  case CC_ScrollBar:
    memset(&rule,0xaa,0x88);
    renderRule(&rule,this,&w->super_QObject,&opt->super_QStyleOption,0);
    bVar4 = QRenderRule::hasDrawable(&rule);
    QRenderRule::~QRenderRule(&rule);
    if ((!bVar4) && (rule.b.d.ptr == (QStyleSheetBoxData *)0x0)) goto switchD_0034cd7e_caseD_6;
  case CC_SpinBox:
  case CC_ComboBox:
  case CC_Slider:
  case CC_ToolButton:
  case CC_GroupBox:
LAB_0034cd86:
    SVar5 = QCommonStyle::hitTestComplexControl((QCommonStyle *)this,cc,opt,pt,w);
    break;
  case CC_TitleBar:
    pQVar7 = qstyleoption_cast<QStyleOptionTitleBar_const*>(&opt->super_QStyleOption);
    if (pQVar7 == (QStyleOptionTitleBar *)0x0) goto switchD_0034cd7e_caseD_6;
    memset(&rule,0xaa,0x88);
    renderRule(&rule,this,&w->super_QObject,&opt->super_QStyleOption,0x41);
    bVar4 = QRenderRule::hasDrawable(&rule);
    pQVar10 = pt;
    if (rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
        (rule.b.d.ptr != (QStyleSheetBoxData *)0x0 || bVar4)) {
      layout.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      titleBarLayout((QStyleSheetStyle *)&layout,(QWidget *)this,(QStyleOptionTitleBar *)w);
      local_d8.xp.m_i = 0;
      local_d8.yp.m_i = 0;
      uStack_d0 = 0xffffffffffffffff;
      pQVar9 = (QPoint *)0x1;
      while (SVar5 = (SubControl)pQVar9, pQVar10 = (QPoint *)0x0,
            SVar5 < (SC_TitleBarLabel|SC_ComboBoxFrame)) {
        local_dc = SVar5;
        pQVar8 = QHash<QStyle::SubControl,_QRect>::operator[](&layout,&local_dc);
        local_d8.xp.m_i = (pQVar8->x1).m_i;
        local_d8.yp.m_i = (pQVar8->y1).m_i;
        uStack_d0._0_4_ = pQVar8->x2;
        uStack_d0._4_4_ = pQVar8->y2;
        if (local_d8.xp.m_i <= (int)(undefined4)uStack_d0) {
          if ((local_d8.yp.m_i <= (int)uStack_d0._4_4_) &&
             (cVar3 = QRect::contains(&local_d8,SUB81(pt,0)), pQVar10 = pQVar9, cVar3 != '\0'))
          break;
        }
        pQVar9 = (QPoint *)(ulong)(SVar5 * 2);
      }
      QHash<QStyle::SubControl,_QRect>::~QHash(&layout);
    }
    SVar5 = (SubControl)pQVar10;
    QRenderRule::~QRenderRule(&rule);
    if (rule.bd.d.ptr == (QStyleSheetBorderData *)0x0 &&
        (rule.b.d.ptr == (QStyleSheetBoxData *)0x0 && !bVar4)) goto switchD_0034cd7e_caseD_6;
    break;
  default:
switchD_0034cd7e_caseD_6:
    pQVar6 = baseStyle(this);
    SVar5 = (**(code **)(*(long *)pQVar6 + 0xd0))(pQVar6,cc,opt,pt,w);
    break;
  case CC_MdiControls:
    bVar4 = hasStyleRule(this,&w->super_QObject,0x3e);
    if (((!bVar4) && (bVar4 = hasStyleRule(this,&w->super_QObject,0x40), !bVar4)) &&
       (bVar4 = hasStyleRule(this,&w->super_QObject,0x3f), !bVar4)) goto switchD_0034cd7e_caseD_6;
    cc = CC_MdiControls;
    goto LAB_0034cd86;
  }
  if (pQVar2 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar5;
  }
LAB_0034cfc0:
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QStyleSheetStyle::hitTestComplexControl(ComplexControl cc, const QStyleOptionComplex *opt,
                                 const QPoint &pt, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->hitTestComplexControl(cc, opt, pt, w))
    switch (cc) {
    case CC_TitleBar:
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            QRenderRule rule = renderRule(w, opt, PseudoElement_TitleBar);
            if (rule.hasDrawable() || rule.hasBox() || rule.hasBorder()) {
                QHash<QStyle::SubControl, QRect> layout = titleBarLayout(w, tb);
                QRect r;
                QStyle::SubControl sc = QStyle::SC_None;
                uint ctrl = SC_TitleBarSysMenu;
                while (ctrl <= SC_TitleBarLabel) {
                    r = layout[QStyle::SubControl(ctrl)];
                    if (r.isValid() && r.contains(pt)) {
                        sc = QStyle::SubControl(ctrl);
                        break;
                    }
                    ctrl <<= 1;
                }
                return sc;
            }
        }
        break;

    case CC_MdiControls:
        if (hasStyleRule(w, PseudoElement_MdiCloseButton)
            || hasStyleRule(w, PseudoElement_MdiNormalButton)
            || hasStyleRule(w, PseudoElement_MdiMinButton))
            return QWindowsStyle::hitTestComplexControl(cc, opt, pt, w);
        break;

    case CC_ScrollBar: {
        QRenderRule rule = renderRule(w, opt);
        if (!rule.hasDrawable() && !rule.hasBox())
            break;
                       }
        Q_FALLTHROUGH();
    case CC_SpinBox:
    case CC_GroupBox:
    case CC_ComboBox:
    case CC_Slider:
    case CC_ToolButton:
        return QWindowsStyle::hitTestComplexControl(cc, opt, pt, w);
    default:
        break;
    }

    return baseStyle()->hitTestComplexControl(cc, opt, pt, w);
}